

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lysp_ext_children_dup(ly_ctx *ctx,lysp_stmt *orig_child,lysp_stmt **child)

{
  LY_ERR LVar1;
  lysp_stmt *plVar2;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lysp_stmt *ch;
  lysp_stmt **child_local;
  lysp_stmt *orig_child_local;
  ly_ctx *ctx_local;
  
  _ret___1 = (lysp_stmt *)0x0;
  child_local = (lysp_stmt **)orig_child;
  if (*child != (lysp_stmt *)0x0) {
    __assert_fail("!*child",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                  ,0x1ae,
                  "LY_ERR lysp_ext_children_dup(const struct ly_ctx *, const struct lysp_stmt *, struct lysp_stmt **)"
                 );
  }
  while( true ) {
    if (child_local == (lysp_stmt **)0x0) {
      return LY_SUCCESS;
    }
    if (*child == (lysp_stmt *)0x0) {
      _ret___1 = (lysp_stmt *)calloc(1,0x38);
      *child = _ret___1;
      if (_ret___1 == (lysp_stmt *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_ext_children_dup");
        return LY_EMEM;
      }
    }
    else {
      plVar2 = (lysp_stmt *)calloc(1,0x38);
      _ret___1->next = plVar2;
      if (_ret___1->next == (lysp_stmt *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_ext_children_dup");
        return LY_EMEM;
      }
      _ret___1 = _ret___1->next;
    }
    LVar1 = lydict_dup(ctx,(char *)*child_local,&_ret___1->stmt);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    _ret___1->flags = *(uint16_t *)(child_local + 6);
    LVar1 = lydict_dup(ctx,(char *)child_local[1],&_ret___1->arg);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    _ret___1->format = *(LY_VALUE_FORMAT *)(child_local + 2);
    LVar1 = ly_dup_prefix_data(ctx,*(LY_VALUE_FORMAT *)(child_local + 2),child_local[3],
                               &_ret___1->prefix_data);
    if (LVar1 != LY_SUCCESS) break;
    _ret___1->kw = *(ly_stmt *)((long)child_local + 0x34);
    LVar1 = lysp_ext_children_dup(ctx,child_local[5],&_ret___1->child);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    child_local = (lysp_stmt **)child_local[4];
  }
  return LVar1;
}

Assistant:

static LY_ERR
lysp_ext_children_dup(const struct ly_ctx *ctx, const struct lysp_stmt *orig_child, struct lysp_stmt **child)
{
    struct lysp_stmt *ch = NULL;

    assert(!*child);

    LY_LIST_FOR(orig_child, orig_child) {
        /* new child */
        if (!*child) {
            *child = ch = calloc(1, sizeof *ch);
            LY_CHECK_ERR_RET(!ch, LOGMEM(ctx), LY_EMEM);
        } else {
            ch->next = calloc(1, sizeof *ch);
            LY_CHECK_ERR_RET(!ch->next, LOGMEM(ctx), LY_EMEM);
            ch = ch->next;
        }

        /* fill */
        DUP_STRING_RET(ctx, orig_child->stmt, ch->stmt);
        ch->flags = orig_child->flags;
        DUP_STRING_RET(ctx, orig_child->arg, ch->arg);
        ch->format = orig_child->format;
        LY_CHECK_RET(ly_dup_prefix_data(ctx, orig_child->format, orig_child->prefix_data, &(ch->prefix_data)));
        ch->kw = orig_child->kw;

        /* recursive children */
        LY_CHECK_RET(lysp_ext_children_dup(ctx, orig_child->child, &ch->child));
    }

    return LY_SUCCESS;
}